

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegCheckCharacter(xmlRegAtomPtr atom,int codepoint)

{
  xmlRegAtomType type;
  int iVar1;
  xmlRegRangePtr pxVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  xmlChar *in_R9;
  long lVar6;
  
  if (codepoint < 0x100) {
    if (codepoint < 0x20) {
      if (0xd < (uint)codepoint) {
        return -1;
      }
      if ((0x2600U >> (codepoint & 0x1fU) & 1) == 0) {
        return -1;
      }
    }
  }
  else if (0xfffff < codepoint - 0x10000U &&
           (0x1ffd < codepoint - 0xe000U && 0xd7ff < (uint)codepoint)) {
    return -1;
  }
  type = atom->type;
  if (type - XML_REGEXP_LETTER < 0x25) {
switchD_0017d115_caseD_6:
    uVar3 = xmlRegCheckCharacterRange(type,codepoint,0,0,(int)atom->valuep,in_R9);
    if (atom->neg != 0) {
      uVar3 = (uint)(uVar3 == 0);
    }
  }
  else {
    switch(type) {
    case XML_REGEXP_EPSILON:
    case XML_REGEXP_SUBREG:
    case XML_REGEXP_STRING:
      uVar3 = 0xffffffff;
      break;
    case XML_REGEXP_CHARVAL:
      uVar3 = (uint)(atom->codepoint == codepoint);
      break;
    case XML_REGEXP_RANGES:
      if (0 < atom->nbRanges) {
        lVar6 = 0;
        iVar5 = 0;
        do {
          pxVar2 = atom->ranges[lVar6];
          iVar1 = pxVar2->neg;
          iVar4 = xmlRegCheckCharacterRange
                            (pxVar2->type,codepoint,pxVar2->start,pxVar2->end,(int)pxVar2->blockName
                             ,in_R9);
          if (iVar1 == 0) {
            if (iVar4 != 0) {
              iVar5 = 1;
            }
          }
          else {
            if (iVar1 != 2) {
              iVar5 = 1;
            }
            if (iVar4 != 0) break;
          }
          lVar6 = lVar6 + 1;
          if (atom->nbRanges <= lVar6) {
            return iVar5;
          }
        } while( true );
      }
    default:
      uVar3 = 0;
      break;
    case XML_REGEXP_ANYCHAR:
    case XML_REGEXP_ANYSPACE:
    case XML_REGEXP_NOTSPACE:
    case XML_REGEXP_INITNAME:
    case XML_REGEXP_NOTINITNAME:
    case XML_REGEXP_NAMECHAR:
    case XML_REGEXP_NOTNAMECHAR:
    case XML_REGEXP_DECIMAL:
    case XML_REGEXP_NOTDECIMAL:
    case XML_REGEXP_REALCHAR:
    case XML_REGEXP_NOTREALCHAR:
      goto switchD_0017d115_caseD_6;
    }
  }
  return uVar3;
}

Assistant:

static int
xmlRegCheckCharacter(xmlRegAtomPtr atom, int codepoint) {
    int i, ret = 0;
    xmlRegRangePtr range;

    if ((atom == NULL) || (!IS_CHAR(codepoint)))
	return(-1);

    switch (atom->type) {
        case XML_REGEXP_SUBREG:
        case XML_REGEXP_EPSILON:
	    return(-1);
        case XML_REGEXP_CHARVAL:
            return(codepoint == atom->codepoint);
        case XML_REGEXP_RANGES: {
	    int accept = 0;

	    for (i = 0;i < atom->nbRanges;i++) {
		range = atom->ranges[i];
		if (range->neg == 2) {
		    ret = xmlRegCheckCharacterRange(range->type, codepoint,
						0, range->start, range->end,
						range->blockName);
		    if (ret != 0)
			return(0); /* excluded char */
		} else if (range->neg) {
		    ret = xmlRegCheckCharacterRange(range->type, codepoint,
						0, range->start, range->end,
						range->blockName);
		    if (ret == 0)
		        accept = 1;
		    else
		        return(0);
		} else {
		    ret = xmlRegCheckCharacterRange(range->type, codepoint,
						0, range->start, range->end,
						range->blockName);
		    if (ret != 0)
			accept = 1; /* might still be excluded */
		}
	    }
	    return(accept);
	}
        case XML_REGEXP_STRING:
	    return(-1);
        case XML_REGEXP_ANYCHAR:
        case XML_REGEXP_ANYSPACE:
        case XML_REGEXP_NOTSPACE:
        case XML_REGEXP_INITNAME:
        case XML_REGEXP_NOTINITNAME:
        case XML_REGEXP_NAMECHAR:
        case XML_REGEXP_NOTNAMECHAR:
        case XML_REGEXP_DECIMAL:
        case XML_REGEXP_NOTDECIMAL:
        case XML_REGEXP_REALCHAR:
        case XML_REGEXP_NOTREALCHAR:
        case XML_REGEXP_LETTER:
        case XML_REGEXP_LETTER_UPPERCASE:
        case XML_REGEXP_LETTER_LOWERCASE:
        case XML_REGEXP_LETTER_TITLECASE:
        case XML_REGEXP_LETTER_MODIFIER:
        case XML_REGEXP_LETTER_OTHERS:
        case XML_REGEXP_MARK:
        case XML_REGEXP_MARK_NONSPACING:
        case XML_REGEXP_MARK_SPACECOMBINING:
        case XML_REGEXP_MARK_ENCLOSING:
        case XML_REGEXP_NUMBER:
        case XML_REGEXP_NUMBER_DECIMAL:
        case XML_REGEXP_NUMBER_LETTER:
        case XML_REGEXP_NUMBER_OTHERS:
        case XML_REGEXP_PUNCT:
        case XML_REGEXP_PUNCT_CONNECTOR:
        case XML_REGEXP_PUNCT_DASH:
        case XML_REGEXP_PUNCT_OPEN:
        case XML_REGEXP_PUNCT_CLOSE:
        case XML_REGEXP_PUNCT_INITQUOTE:
        case XML_REGEXP_PUNCT_FINQUOTE:
        case XML_REGEXP_PUNCT_OTHERS:
        case XML_REGEXP_SEPAR:
        case XML_REGEXP_SEPAR_SPACE:
        case XML_REGEXP_SEPAR_LINE:
        case XML_REGEXP_SEPAR_PARA:
        case XML_REGEXP_SYMBOL:
        case XML_REGEXP_SYMBOL_MATH:
        case XML_REGEXP_SYMBOL_CURRENCY:
        case XML_REGEXP_SYMBOL_MODIFIER:
        case XML_REGEXP_SYMBOL_OTHERS:
        case XML_REGEXP_OTHER:
        case XML_REGEXP_OTHER_CONTROL:
        case XML_REGEXP_OTHER_FORMAT:
        case XML_REGEXP_OTHER_PRIVATE:
        case XML_REGEXP_OTHER_NA:
	case XML_REGEXP_BLOCK_NAME:
	    ret = xmlRegCheckCharacterRange(atom->type, codepoint, 0, 0, 0,
		                            (const xmlChar *)atom->valuep);
	    if (atom->neg)
		ret = !ret;
	    break;
    }
    return(ret);
}